

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O2

LispPTR N_OP_lsh(LispPTR a,LispPTR b)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  uint uVar3;
  byte bVar4;
  LispPTR LVar5;
  
  if ((b & 0xfff0000) == 0xf0000) {
    LVar5 = b | 0xffff0000;
  }
  else if ((b & 0xfff0000) == 0xe0000) {
    LVar5 = b & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(b >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(b);
    LVar5 = *pLVar2;
  }
  if ((a & 0xfff0000) == 0xf0000) {
    uVar1 = a | 0xffff0000;
  }
  else if ((a & 0xfff0000) == 0xe0000) {
    uVar1 = a & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(a);
    uVar1 = *pLVar2;
  }
  bVar4 = (byte)LVar5;
  if ((int)LVar5 < 1) {
    if (-1 < (int)LVar5) {
      return a;
    }
    if (0xffffffe0 < LVar5) {
      uVar3 = (int)uVar1 >> (-bVar4 & 0x1f);
      goto LAB_00129153;
    }
  }
  else if ((LVar5 < 0x20) &&
          (uVar3 = uVar1 << (bVar4 & 0x1f), (int)uVar3 >> (bVar4 & 0x1f) == uVar1)) {
LAB_00129153:
    if ((uVar3 & 0xffff0000) == 0xffff0000) {
      return uVar3 & 0xffff | 0xf0000;
    }
    if ((uVar3 & 0xffff0000) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar3;
      LVar5 = LAddrFromNative(NAddr);
      return LVar5;
    }
    return uVar3 | 0xe0000;
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = b;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_lsh(LispPTR a, LispPTR b) {
  int arg, arg2;
  int size;
  /*DLword	*wordp;*/

  N_GETNUMBER(b, size, do_ufn);
  N_GETNUMBER(a, arg2, do_ufn);

  if (size > 0) {
    if (size > 31) goto do_ufn;
    arg = arg2 << size;
    if ((arg >> size) != arg2) goto do_ufn;
  } else if (size < 0) {
    if (size < -31) goto do_ufn;
    arg = arg2 >> -size;
    /*** Commented out JDS 1/27/89:  This punts if you shifted ***/
    /*** ANY 1 bits off the right edge.  You CAN'T overflow    ***/
    /*** in this direction!!                                   ***/
    /*		if ((arg << -size) != arg2) goto do_ufn; */
  } else
    return (a);

  N_ARITH_SWITCH(arg);

do_ufn:
  ERROR_EXIT(b);
}